

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

clip_image_size
llava_uhd::select_best_resolution
          (vector<int,_std::allocator<int>_> *pinpoints,clip_image_size *original_size)

{
  pointer piVar1;
  clip_image_size cVar2;
  size_t i;
  ulong uVar3;
  vector<clip_image_size,_std::allocator<clip_image_size>_> possible_resolutions;
  clip_image_size local_50;
  _Vector_base<clip_image_size,_std::allocator<clip_image_size>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar3 = 0;
      piVar1 = (pinpoints->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(pinpoints->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar3 = uVar3 + 2) {
    local_50.width = piVar1[uVar3];
    local_50.height = piVar1[uVar3 + 1];
    std::vector<clip_image_size,_std::allocator<clip_image_size>_>::emplace_back<clip_image_size>
              ((vector<clip_image_size,_std::allocator<clip_image_size>_> *)&local_48,&local_50);
  }
  cVar2 = select_best_resolution
                    (original_size,
                     (vector<clip_image_size,_std::allocator<clip_image_size>_> *)&local_48);
  std::_Vector_base<clip_image_size,_std::allocator<clip_image_size>_>::~_Vector_base(&local_48);
  return cVar2;
}

Assistant:

static clip_image_size select_best_resolution(const std::vector<int32_t> & pinpoints, const clip_image_size & original_size) {
        std::vector<clip_image_size> possible_resolutions;
        for (size_t i = 0; i < pinpoints.size(); i += 2) {
            possible_resolutions.push_back(clip_image_size{pinpoints[i], pinpoints[i+1]});
        }
        return select_best_resolution(original_size, possible_resolutions);
    }